

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void OpenSteer::drawCircleOrDisk
               (float radius,Vec3 *axis,Vec3 *center,Color *color,int segments,bool filled,bool in3d
               )

{
  undefined4 uVar1;
  undefined4 uVar2;
  GLenum GVar3;
  PFNGLCOLOR3FPROC p_Var4;
  undefined1 auVar5 [16];
  int iVar6;
  Vec3 *pVVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar8;
  float *pfVar9;
  undefined3 in_register_00000081;
  undefined4 uVar10;
  undefined4 in_register_00000084;
  undefined3 in_register_00000089;
  int iVar11;
  bool bVar12;
  GLfloat extraout_XMM0_Da;
  float fVar13;
  GLfloat GVar14;
  GLfloat GVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  GLfloat GVar16;
  Vec3 VVar17;
  Vec3 VVar18;
  int in_stack_ffffffffffffff48;
  Vec3 local_a0;
  GLfloat local_90;
  GLfloat local_8c;
  undefined1 local_88 [16];
  float cos;
  float sin;
  LocalSpaceMixin<OpenSteer::AbstractLocalSpace> local_68;
  
  pVVar7 = center;
  uVar10 = CONCAT31(in_register_00000081,filled);
  iVar11 = CONCAT31(in_register_00000089,in3d);
  iVar6 = segments;
  LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::LocalSpaceMixin(&local_68);
  pvVar8 = extraout_RDX;
  if (CONCAT31(in_register_00000089,in3d) != 0) {
    VVar17 = Vec3::normalize(axis);
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_8_ = VVar17._0_8_;
    local_88._12_4_ = extraout_XMM0_Dd;
    VVar18 = findPerpendicularIn3d(axis);
    local_a0.z = VVar18.z;
    local_a0.x = VVar18.x;
    local_a0.y = VVar18.y;
    VVar18 = Vec3::normalize(&local_a0);
    auVar5 = local_88;
    local_68._forward.z = VVar18.z;
    local_68._up.x = (float)local_88._0_4_;
    local_68._up.y = (float)local_88._4_4_;
    local_68._forward._0_8_ = VVar18._0_8_;
    local_68._position.x = center->x;
    local_68._position.y = center->y;
    local_68._position.z = center->z;
    local_88 = auVar5;
    local_68._up.z = VVar17.z;
    LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::setUnitSideFromForwardAndUp(&local_68);
    pvVar8 = extraout_RDX_00;
  }
  local_88._0_4_ = CONCAT31(in_register_00000081,filled);
  if (filled) {
    (*glad_glPushAttrib)(0x2000);
    (*glad_glDisable)(0xb44);
    GVar3 = 6;
    pvVar8 = extraout_RDX_01;
  }
  else {
    GVar3 = 2;
  }
  p_Var4 = glad_glColor3f;
  local_a0.y = 0.0;
  local_a0.z = 0.0;
  local_a0.x = radius;
  Color::r(color,pVVar7,pvVar8,iVar6,(char *)CONCAT44(in_register_00000084,uVar10),iVar11,
           in_stack_ffffffffffffff48);
  local_8c = extraout_XMM0_Da;
  local_90 = Color::g(color);
  fVar13 = Color::b(color);
  (*p_Var4)(local_8c,local_90,fVar13);
  (*glad_glBegin)(GVar3);
  uVar10 = local_88._0_4_;
  if (local_88[0] != '\0') {
    pVVar7 = &local_68._position;
    if (!in3d) {
      pVVar7 = center;
    }
    uVar1 = pVVar7->x;
    uVar2 = pVVar7->y;
    pfVar9 = &center->z;
    if (in3d) {
      pfVar9 = &local_68._position.z;
    }
    (*glad_glVertex3f)((GLfloat)uVar1,(GLfloat)uVar2,*pfVar9);
  }
  sin = 0.0;
  cos = 0.0;
  iVar6 = (uVar10 & 0xff) + segments;
  iVar11 = 0;
  if (0 < iVar6) {
    iVar11 = iVar6;
  }
  while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
    if (in3d) {
      VVar17 = LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::globalizePosition
                         (&local_68,&local_a0);
      GVar16 = VVar17.z;
      GVar14 = VVar17.x;
      GVar15 = VVar17.y;
    }
    else {
      VVar17 = Vec3::operator+(&local_a0,center);
      GVar16 = VVar17.z;
      GVar14 = VVar17.x;
      GVar15 = VVar17.y;
    }
    (*glad_glVertex3f)(GVar14,GVar15,GVar16);
    VVar17 = Vec3::rotateAboutGlobalY(&local_a0,6.2831855 / (float)segments,&sin,&cos);
    local_a0.z = VVar17.z;
    local_a0.x = VVar17.x;
    local_a0.y = VVar17.y;
  }
  (*glad_glEnd)();
  if (local_88[0] != '\0') {
    (*glad_glPopAttrib)();
  }
  return;
}

Assistant:

void 
OpenSteer::drawCircleOrDisk (const float radius,
                             const Vec3& axis,
                             const Vec3& center,
                             const Color& color,
                             const int segments,
                             const bool filled,
                             const bool in3d)
{
    LocalSpace ls;
    if (in3d)
    {
        // define a local space with "axis" as the Y/up direction
        // (XXX should this be a method on  LocalSpace?)
        const Vec3 unitAxis = axis.normalize ();
        const Vec3 unitPerp = findPerpendicularIn3d (axis).normalize ();
        ls.setUp (unitAxis);
        ls.setForward (unitPerp);
        ls.setPosition (center);
        ls.setUnitSideFromForwardAndUp ();
    }
        
    // make disks visible (not culled) from both sides 
    if (filled) beginDoubleSidedDrawing ();

    // point to be rotated about the (local) Y axis, angular step size
    Vec3 pointOnCircle (radius, 0, 0);
    const float step = (2 * OPENSTEER_M_PI) / segments;

    // set drawing color
    glColor3f (color.r(), color.g(), color.b());

    // begin drawing a triangle fan (for disk) or line loop (for circle)
    glBegin (filled ? GL_TRIANGLE_FAN : GL_LINE_LOOP);

    // for the filled case, first emit the center point
    if (filled) iglVertexVec3 (in3d ? ls.position() : center);

    // rotate p around the circle in "segments" steps
    float sin=0, cos=0;
    const int vertexCount = filled ? segments+1 : segments;
    for (int i = 0; i < vertexCount; i++)
    {
        // emit next point on circle, either in 3d (globalized out
        // of the local space), or in 2d (offset from the center)
        iglVertexVec3 (in3d ?
                           ls.globalizePosition (pointOnCircle) :
                           (Vec3) (pointOnCircle + center));

        // rotate point one more step around circle
        pointOnCircle = pointOnCircle.rotateAboutGlobalY (step, sin, cos);
    }

    // close drawing operation
    glEnd ();
    if (filled) endDoubleSidedDrawing ();
}